

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLElement::ParseAttributes(XMLElement *this,char *p,int *curLineNumPtr)

{
  int iVar1;
  XMLDocument *pXVar2;
  bool bVar3;
  uchar *p_00;
  char *pcVar4;
  XMLAttribute *this_00;
  int attrLineNum;
  XMLAttribute *attrib;
  XMLAttribute *prevAttribute;
  int *curLineNumPtr_local;
  char *p_local;
  XMLElement *this_local;
  
  attrib = (XMLAttribute *)0x0;
  curLineNumPtr_local = (int *)p;
  while( true ) {
    if (curLineNumPtr_local == (int *)0x0) {
      return (char *)0x0;
    }
    p_00 = (uchar *)XMLUtil::SkipWhiteSpace((char *)curLineNumPtr_local,curLineNumPtr);
    if (*p_00 == '\0') {
      pXVar2 = (this->super_XMLNode)._document;
      iVar1 = (this->super_XMLNode)._parseLineNum;
      pcVar4 = Name(this);
      XMLDocument::SetError(pXVar2,XML_ERROR_PARSING_ELEMENT,iVar1,"XMLElement name=%s",pcVar4);
      return (char *)0x0;
    }
    bVar3 = XMLUtil::IsNameStartChar(*p_00);
    if (!bVar3) {
      if (*p_00 == '>') {
        return (char *)(p_00 + 1);
      }
      if ((*p_00 == '/') && (p_00[1] == '>')) {
        this->_closingType = CLOSED;
        return (char *)(p_00 + 2);
      }
      XMLDocument::SetError
                ((this->super_XMLNode)._document,XML_ERROR_PARSING_ELEMENT,
                 (this->super_XMLNode)._parseLineNum,(char *)0x0);
      return (char *)0x0;
    }
    this_00 = CreateAttribute(this);
    this_00->_parseLineNum = ((this->super_XMLNode)._document)->_parseCurLineNum;
    iVar1 = this_00->_parseLineNum;
    bVar3 = XMLDocument::ProcessEntities((this->super_XMLNode)._document);
    curLineNumPtr_local = (int *)XMLAttribute::ParseDeep(this_00,(char *)p_00,bVar3,curLineNumPtr);
    if (curLineNumPtr_local == (int *)0x0) break;
    pcVar4 = XMLAttribute::Name(this_00);
    pcVar4 = Attribute(this,pcVar4,(char *)0x0);
    if (pcVar4 != (char *)0x0) break;
    if (attrib == (XMLAttribute *)0x0) {
      this->_rootAttribute = this_00;
      attrib = this_00;
    }
    else {
      attrib->_next = this_00;
      attrib = this_00;
    }
  }
  DeleteAttribute(this_00);
  pXVar2 = (this->super_XMLNode)._document;
  pcVar4 = Name(this);
  XMLDocument::SetError(pXVar2,XML_ERROR_PARSING_ATTRIBUTE,iVar1,"XMLElement name=%s",pcVar4);
  return (char *)0x0;
}

Assistant:

char* XMLElement::ParseAttributes( char* p, int* curLineNumPtr )
{
    XMLAttribute* prevAttribute = 0;

    // Read the attributes.
    while( p ) {
        p = XMLUtil::SkipWhiteSpace( p, curLineNumPtr );
        if ( !(*p) ) {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, _parseLineNum, "XMLElement name=%s", Name() );
            return 0;
        }

        // attribute.
        if (XMLUtil::IsNameStartChar( *p ) ) {
            XMLAttribute* attrib = CreateAttribute();
            TIXMLASSERT( attrib );
            attrib->_parseLineNum = _document->_parseCurLineNum;

            const int attrLineNum = attrib->_parseLineNum;

            p = attrib->ParseDeep( p, _document->ProcessEntities(), curLineNumPtr );
            if ( !p || Attribute( attrib->Name() ) ) {
                DeleteAttribute( attrib );
                _document->SetError( XML_ERROR_PARSING_ATTRIBUTE, attrLineNum, "XMLElement name=%s", Name() );
                return 0;
            }
            // There is a minor bug here: if the attribute in the source xml
            // document is duplicated, it will not be detected and the
            // attribute will be doubly added. However, tracking the 'prevAttribute'
            // avoids re-scanning the attribute list. Preferring performance for
            // now, may reconsider in the future.
            if ( prevAttribute ) {
                TIXMLASSERT( prevAttribute->_next == 0 );
                prevAttribute->_next = attrib;
            }
            else {
                TIXMLASSERT( _rootAttribute == 0 );
                _rootAttribute = attrib;
            }
            prevAttribute = attrib;
        }
        // end of the tag
        else if ( *p == '>' ) {
            ++p;
            break;
        }
        // end of the tag
        else if ( *p == '/' && *(p+1) == '>' ) {
            _closingType = CLOSED;
            return p+2;	// done; sealed element.
        }
        else {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, _parseLineNum, 0 );
            return 0;
        }
    }
    return p;
}